

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

N_Vector * N_VCloneVectorArray_Serial(int count,N_Vector w)

{
  N_Vector *vs;
  N_Vector p_Var1;
  ulong uVar2;
  
  if (0 < count) {
    vs = (N_Vector *)malloc((ulong)(uint)count * 8);
    if (vs != (N_Vector *)0x0) {
      uVar2 = 0;
      while( true ) {
        vs[uVar2] = (N_Vector)0x0;
        p_Var1 = N_VClone_Serial(w);
        vs[uVar2] = p_Var1;
        if (p_Var1 == (N_Vector)0x0) break;
        uVar2 = uVar2 + 1;
        if ((uint)count == uVar2) {
          return vs;
        }
      }
      N_VDestroyVectorArray_Serial(vs,(int)uVar2 + -1);
    }
  }
  return (N_Vector *)0x0;
}

Assistant:

N_Vector *N_VCloneVectorArray_Serial(int count, N_Vector w)
{
  N_Vector *vs;
  int j;

  if (count <= 0) return(NULL);

  vs = NULL;
  vs = (N_Vector *) malloc(count * sizeof(N_Vector));
  if(vs == NULL) return(NULL);

  for (j = 0; j < count; j++) {
    vs[j] = NULL;
    vs[j] = N_VClone_Serial(w);
    if (vs[j] == NULL) {
      N_VDestroyVectorArray_Serial(vs, j-1);
      return(NULL);
    }
  }

  return(vs);
}